

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O2

int __thiscall CheaterBotStrategy::cheaterReinforce(CheaterBotStrategy *this)

{
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar1;
  pointer ppCVar2;
  Country *this_00;
  ostream *poVar3;
  pointer ppCVar4;
  int iVar5;
  string local_50;
  
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "We have a cheater! They are doubling all armies on their countries");
  std::endl<char,std::char_traits<char>>(poVar3);
  pvVar1 = ((this->super_PlayerStrategy).player)->pOwnedCountries;
  ppCVar2 = (pvVar1->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppCVar4 = (pvVar1->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                 _M_impl.super__Vector_impl_data._M_start; ppCVar4 != ppCVar2; ppCVar4 = ppCVar4 + 1
      ) {
    this_00 = *ppCVar4;
    poVar3 = std::operator<<((ostream *)&std::cout,"[CHEATER] - Country ");
    Map::Country::getCountryName_abi_cxx11_(&local_50,this_00);
    poVar3 = std::operator<<(poVar3,(string *)&local_50);
    poVar3 = std::operator<<(poVar3," had ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*this_00->pNumberOfTroops);
    std::operator<<(poVar3," armies. It now has ");
    std::__cxx11::string::~string((string *)&local_50);
    iVar5 = *this_00->pNumberOfTroops;
    if (0 < iVar5) {
      iVar5 = iVar5 * 2;
      *this_00->pNumberOfTroops = iVar5;
    }
    poVar3 = (ostream *)std::ostream::operator<<(&std::cout,iVar5);
    poVar3 = std::operator<<(poVar3," armies. -");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  Player::setPlayerState((this->super_PlayerStrategy).player,IDLE);
  (*((this->super_PlayerStrategy).player)->strategy->_vptr_PlayerStrategy[5])();
  return 1;
}

Assistant:

int CheaterBotStrategy::cheaterReinforce() {
    std::cout << "We have a cheater! They are doubling all armies on their countries" << std::endl;

    for(auto* country : *this->player->getOwnedCountries()) {
        std::cout << "[CHEATER] - Country " << country->getCountryName() << " had " << country->getNumberOfTroops() << " armies. It now has ";
        //prevent overflow
        if(country->getNumberOfTroops() * 2 > 0 && country->getNumberOfTroops() * 2 < 2147483647){
            country->setNumberOfTroops(country->getNumberOfTroops() * 2);
        }
        std::cout << country->getNumberOfTroops() << " armies. -" << std::endl;
    }

    player->setPlayerState(PlayerState::IDLE);
    player->getStrategy()->resetChoices();
    return PlayerAction::SUCCEEDED;
}